

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::CommitDescriptorSets
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo,Uint32 CommitSRBMask)

{
  SRBMaskType *pSVar1;
  uint32_t uVar2;
  uint uVar3;
  VkPipelineBindPoint VVar4;
  PipelineStateVkImpl *this_00;
  ShaderResourceCacheVk *this_01;
  uint32_t *puVar5;
  uint uVar6;
  Uint32 UVar7;
  uint uVar8;
  char (*in_RCX) [63];
  uint uVar9;
  char (*in_R8) [50];
  VkPipelineLayout pVVar10;
  string msg;
  uint local_64;
  char (*local_60) [63];
  uint local_54;
  VkPipelineLayout local_50;
  ResourceBindInfo *local_48;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  if (CommitSRBMask == 0) {
    FormatString<char[65]>
              (&msg,(char (*) [65])
                    "This method should not be called when there is nothing to commit");
    in_RCX = (char (*) [63])0x1a4;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  uVar8 = 0x20;
  if ((CommitSRBMask != 0) && (uVar8 = 0, CommitSRBMask != 0)) {
    for (; (CommitSRBMask >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
    }
  }
  uVar9 = 0x1f;
  if (CommitSRBMask != 0) {
    for (; CommitSRBMask >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  if (CommitSRBMask == 0) {
    uVar9 = 0x20;
  }
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  local_54 = uVar9;
  if ((this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount <= uVar9) {
    FormatString<char[26],char[57]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LastSign < m_pPipelineState->GetResourceSignatureCount()",
               (char (*) [57])in_RCX);
    in_RCX = (char (*) [63])0x1a8;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = *(uint32_t *)((long)(&(BindInfo->SetInfo)._M_elems[0].vkSets + 1) + (ulong)(uVar8 << 5));
  uVar9 = 0;
  local_60 = (char (*) [63])0x0;
  local_64 = uVar8;
  local_3c = CommitSRBMask;
  if (uVar8 <= local_54) {
    local_50 = (VkPipelineLayout)&BindInfo->SetInfo;
    local_38 = &this->m_DynamicBufferOffsets;
    local_60 = (char (*) [63])0x0;
    uVar9 = 0;
    local_48 = BindInfo;
    do {
      local_64 = uVar8;
      if ((*(long *)(local_50 + (ulong)uVar8 * 0x20) == 0) &&
         ((local_3c >> (uVar8 & 0x1f) & 1) != 0)) {
        FormatString<char[131]>
                  (&msg,(char (*) [131])
                        "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()"
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1b2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      pVVar10 = local_50 + (ulong)uVar8 * 0x20;
      in_RCX = (char (*) [63])(ulong)local_64;
      if ((((BindInfo->super_CommittedShaderResources).ActiveSRBMask >> (local_64 & 0x1f) & 1) == 0)
         && (*(long *)pVVar10 != 0)) {
        FormatString<char[48]>
                  (&msg,(char (*) [48])"Descriptor sets must be null for inactive slots");
        in_RCX = (char (*) [63])0x1b4;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1b4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(long *)pVVar10 == 0) {
        if (*(long *)(pVVar10 + 8) != 0) {
          FormatString<char[26],char[36]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SetInfo.vkSets[1] == VK_NULL_HANDLE",(char (*) [36])in_RCX);
          in_RCX = (char (*) [63])0x1b7;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1b7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        uVar8 = uVar9 + uVar2;
        if (*(uint *)(pVVar10 + 0x10) < uVar8) {
          FormatString<char[26],char[50]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SetInfo.BaseInd >= FirstSetToBind + TotalSetCount",
                     (char (*) [50])in_RCX);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1bb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        uVar3 = *(uint *)(pVVar10 + 0x10);
        uVar6 = uVar9;
        while (uVar8 < uVar3) {
          (this->m_DescriptorSets)._M_elems[uVar6] = (VkDescriptorSet_T *)0x0;
          uVar8 = uVar2 + uVar6 + 1;
          uVar6 = uVar6 + 1;
        }
        this_01 = (local_48->super_CommittedShaderResources).ResourceCaches._M_elems[local_64];
        if (this_01 == (ShaderResourceCacheVk *)0x0) {
          FormatString<char[33],unsigned_int,char[50]>
                    (&msg,(Diligent *)"Resource cache at binding index ",(char (*) [33])&local_64,
                     (uint *)" is null, but corresponding descriptor set is not",in_R8);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        BindInfo = local_48;
        in_RCX = (char (*) [63])(ulong)uVar6;
        (this->m_DescriptorSets)._M_elems[(long)in_RCX] = *(VkDescriptorSet_T **)pVVar10;
        uVar9 = uVar6 + 1;
        if (*(VkDescriptorSet_T **)(pVVar10 + 8) != (VkDescriptorSet_T *)0x0) {
          uVar9 = uVar6 + 2;
          in_RCX = (char (*) [63])(ulong)(uVar6 + 1);
          (this->m_DescriptorSets)._M_elems[(long)in_RCX] = *(VkDescriptorSet_T **)(pVVar10 + 8);
        }
        if ((ulong)*(uint *)(pVVar10 + 0x14) != 0) {
          if ((ulong)((long)(this->m_DynamicBufferOffsets).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_DynamicBufferOffsets).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <
              (ulong)*(uint *)(pVVar10 + 0x14) + ((ulong)local_60 & 0xffffffff)) {
            FormatString<char[87]>
                      (&msg,(char (*) [87])
                            "m_DynamicBufferOffsets must\'ve been resized by SetPipelineState() to have enough space"
                      );
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"CommitDescriptorSets",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1c9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          in_RCX = local_60;
          UVar7 = ShaderResourceCacheVk::GetDynamicBufferOffsets
                            (this_01,this,local_38,(Uint32)local_60);
          if (UVar7 != *(Uint32 *)(pVVar10 + 0x14)) {
            FormatString<char[26],char[48]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"NumOffsetsWritten == SetInfo.DynamicOffsetCount",
                       (char (*) [48])in_RCX);
            in_RCX = (char (*) [63])0x1cc;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"CommitDescriptorSets",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1cc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          local_60 = (char (*) [63])(ulong)(uint)((int)local_60 + *(int *)(pVVar10 + 0x14));
        }
        *(undefined4 *)(pVVar10 + 0x18) = *(undefined4 *)(pVVar10 + 0x10);
      }
      uVar8 = local_64 + 1;
      local_64 = uVar8;
    } while (uVar8 <= local_54);
  }
  if ((this->m_State).vkPipelineBindPoint == VK_PIPELINE_BIND_POINT_MAX_ENUM) {
    FormatString<char[26],char[63]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM",
               in_RCX);
    in_RCX = (char (*) [63])0x1dd;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1dd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  VVar4 = (this->m_State).vkPipelineBindPoint;
  puVar5 = (this->m_DynamicBufferOffsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar10 = BindInfo->vkPipelineLayout;
  if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    local_50 = BindInfo->vkPipelineLayout;
    FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1f7);
    pVVar10 = local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      pVVar10 = local_50;
    }
  }
  (*vkCmdBindDescriptorSets)
            ((this->m_CommandBuffer).m_VkCmdBuffer,VVar4,pVVar10,uVar2,uVar9,
             (this->m_DescriptorSets)._M_elems,(uint32_t)local_60,puVar5);
  pSVar1 = &(BindInfo->super_CommittedShaderResources).StaleSRBMask;
  *pSVar1 = *pSVar1 & ~(BindInfo->super_CommittedShaderResources).ActiveSRBMask;
  return;
}

Assistant:

void DeviceContextVkImpl::CommitDescriptorSets(ResourceBindInfo& BindInfo, Uint32 CommitSRBMask)
{
    VERIFY(CommitSRBMask != 0, "This method should not be called when there is nothing to commit");

    const Uint32 FirstSign = PlatformMisc::GetLSB(CommitSRBMask);
    const Uint32 LastSign  = PlatformMisc::GetMSB(CommitSRBMask);
    VERIFY_EXPR(LastSign < m_pPipelineState->GetResourceSignatureCount());

    // Bind all descriptor sets in a single BindDescriptorSets call
    uint32_t     DynamicOffsetCount = 0;
    uint32_t     TotalSetCount      = 0;
    const Uint32 FirstSetToBind     = BindInfo.SetInfo[FirstSign].BaseInd;
    for (Uint32 sign = FirstSign; sign <= LastSign; ++sign)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[sign];
        VERIFY(SetInfo.vkSets[0] != VK_NULL_HANDLE || (CommitSRBMask & (1u << sign)) == 0,
               "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()");

        VERIFY((BindInfo.ActiveSRBMask & (1u << sign)) != 0 || SetInfo.vkSets[0] == VK_NULL_HANDLE, "Descriptor sets must be null for inactive slots");
        if (SetInfo.vkSets[0] == VK_NULL_HANDLE)
        {
            VERIFY_EXPR(SetInfo.vkSets[1] == VK_NULL_HANDLE);
            continue;
        }

        VERIFY_EXPR(SetInfo.BaseInd >= FirstSetToBind + TotalSetCount);
        while (FirstSetToBind + TotalSetCount < SetInfo.BaseInd)
            m_DescriptorSets[TotalSetCount++] = VK_NULL_HANDLE;

        const ShaderResourceCacheVk* pResourceCache = BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at binding index ", sign, " is null, but corresponding descriptor set is not");

        m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[0];
        if (SetInfo.vkSets[1] != VK_NULL_HANDLE)
            m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[1];

        if (SetInfo.DynamicOffsetCount > 0)
        {
            VERIFY(m_DynamicBufferOffsets.size() >= size_t{DynamicOffsetCount} + size_t{SetInfo.DynamicOffsetCount},
                   "m_DynamicBufferOffsets must've been resized by SetPipelineState() to have enough space");

            Uint32 NumOffsetsWritten = pResourceCache->GetDynamicBufferOffsets(this, m_DynamicBufferOffsets, DynamicOffsetCount);
            VERIFY_EXPR(NumOffsetsWritten == SetInfo.DynamicOffsetCount);
            DynamicOffsetCount += SetInfo.DynamicOffsetCount;
        }

#ifdef DILIGENT_DEVELOPMENT
        SetInfo.LastBoundBaseInd = SetInfo.BaseInd;
#endif
    }

    // Note that there is one global dynamic buffer from which all dynamic resources are suballocated in Vulkan back-end,
    // and this buffer is not resizable, so the buffer handle can never change.

    // vkCmdBindDescriptorSets causes the sets numbered [firstSet .. firstSet+descriptorSetCount-1] to use the
    // bindings stored in pDescriptorSets[0 .. descriptorSetCount-1] for subsequent rendering commands
    // (either compute or graphics, according to the pipelineBindPoint). Any bindings that were previously
    // applied via these sets are no longer valid.
    // https://www.khronos.org/registry/vulkan/specs/1.3-extensions/man/html/vkCmdBindDescriptorSets.html
    VERIFY_EXPR(m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM);
    m_CommandBuffer.BindDescriptorSets(m_State.vkPipelineBindPoint, BindInfo.vkPipelineLayout, FirstSetToBind, TotalSetCount,
                                       m_DescriptorSets.data(), DynamicOffsetCount, m_DynamicBufferOffsets.data());

    BindInfo.StaleSRBMask &= ~BindInfo.ActiveSRBMask;
}